

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O3

int __thiscall glcts::ViewportArrayTests::init(ViewportArrayTests *this,EVP_PKEY_CTX *ctx)

{
  ExtParameters *extParam;
  int extraout_EAX;
  TestCaseBase *pTVar1;
  
  pTVar1 = (TestCaseBase *)operator_new(0x2b0);
  extParam = &(this->super_TestCaseGroupBase).m_extParams;
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"api_errors",
             "Test verifies error generated by API");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_0210c730
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2b0);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"queries",
             "Test verifies initial state of API");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_0210c768
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2b0);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"viewport_api",
             "Test verifies that \viewport api\" works as expected");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_0210c7a0
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2b0);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"scissor_api",
             "Test verifies that \"scissor api\" works as expected");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_0210c7d8
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2b0);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"depth_range_api",
             "Test verifies that \"depth range api\" works as expected");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_0210c810
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2b0);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"scissor_test_state_api",
             "Test verifies that \"enable/disable api\" works as expected for scissor test");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_0210c848
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2b0);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,
             "draw_to_single_layer_with_multiple_viewports",
             "Test verifies that multiple viewports can be used to draw to single layer");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_0210c910
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2b0);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"dynamic_viewport_index",
             "Test verifies that gl_ViewportIndex can be assigned with dynamic value");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_0210c9a0
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2b0);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,
             "draw_mulitple_viewports_with_single_invocation",
             "Test verifies that single invocation can output to multiple viewports");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_0210ca30
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2b0);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"viewport_index_subroutine",
             "Test verifies subroutines can be used to output data to specific viewport");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_0210cac0
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2b0);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"draw_multiple_layers",
             "Test verifies that single viewport affects multiple layers in the same way");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_0210cb50
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2b0);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"scissor",
             "Test verifies that scissor test is applied as expected");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_0210cbe0
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2b0);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"scissor_zero_dimension",
             "Test verifies that scissor test discard all fragments when width and height is set to zero"
            );
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_0210cc70
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2b0);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"scissor_clear",
             "Test verifies that Clear is affected only by settings of scissor test in first viewport"
            );
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_0210cd00
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2b0);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"depth_range",
             "Test verifies that depth range is applied as expected");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_0210cd90
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2b0);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"depth_range_depth_test",
             "Test verifies that depth test work as expected with multiple viewports");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_0210ce20
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestCaseBase *)operator_new(0x2b0);
  TestCaseBase::TestCaseBase
            (pTVar1,(this->super_TestCaseGroupBase).m_context,extParam,"provoking_vertex",
             "Test verifies that provoking vertex work as expected");
  (pTVar1->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCaseBase_0210ceb0
  ;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void ViewportArrayTests::init(void)
{
	addChild(new ViewportArray::APIErrors(m_context, m_extParams));
	addChild(new ViewportArray::Queries(m_context, m_extParams));
	addChild(new ViewportArray::ViewportAPI(m_context, m_extParams));
	addChild(new ViewportArray::ScissorAPI(m_context, m_extParams));
	addChild(new ViewportArray::DepthRangeAPI(m_context, m_extParams));
	addChild(new ViewportArray::ScissorTestStateAPI(m_context, m_extParams));
	addChild(new ViewportArray::DrawToSingleLayerWithMultipleViewports(m_context, m_extParams));
	addChild(new ViewportArray::DynamicViewportIndex(m_context, m_extParams));
	addChild(new ViewportArray::DrawMulitpleViewportsWithSingleInvocation(m_context, m_extParams));
	addChild(new ViewportArray::ViewportIndexSubroutine(m_context, m_extParams));
	addChild(new ViewportArray::DrawMultipleLayers(m_context, m_extParams));
	addChild(new ViewportArray::Scissor(m_context, m_extParams));
	addChild(new ViewportArray::ScissorZeroDimension(m_context, m_extParams));
	addChild(new ViewportArray::ScissorClear(m_context, m_extParams));
	addChild(new ViewportArray::DepthRange(m_context, m_extParams));
	addChild(new ViewportArray::DepthRangeDepthTest(m_context, m_extParams));
	addChild(new ViewportArray::ProvokingVertex(m_context, m_extParams));
}